

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_unique.hpp
# Opt level: O0

unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
__thiscall
HawkTracer::parser::make_unique<HawkTracer::parser::EventKlass,char_const(&)[9],unsigned_int>
          (parser *this,char (*args) [9],uint *args_1)

{
  uint *puVar1;
  EventKlass *this_00;
  allocator local_41;
  string local_40 [32];
  uint32_t *local_20;
  uint *args_local_1;
  char (*args_local) [9];
  
  local_20 = args_1;
  args_local_1 = (uint *)args;
  args_local = (char (*) [9])this;
  this_00 = (EventKlass *)operator_new(0x68);
  puVar1 = args_local_1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,(char *)puVar1,&local_41);
  EventKlass::EventKlass(this_00,(string *)local_40,*local_20);
  std::
  unique_ptr<HawkTracer::parser::EventKlass,std::default_delete<HawkTracer::parser::EventKlass>>::
  unique_ptr<std::default_delete<HawkTracer::parser::EventKlass>,void>
            ((unique_ptr<HawkTracer::parser::EventKlass,std::default_delete<HawkTracer::parser::EventKlass>>
              *)this,this_00);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return (__uniq_ptr_data<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>,_true,_true>
          )(__uniq_ptr_data<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> make_unique(Args&&... args)
{
    return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}